

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

void __thiscall GGWave::Protocols::disableAll(Protocols *this)

{
  Protocol *p;
  int i;
  Protocols *this_local;
  
  for (i = 0; i < 0x16; i = i + 1) {
    this->data[i].enabled = false;
  }
  return;
}

Assistant:

void GGWave::Protocols::disableAll() {
    for (int i = 0; i < GGWAVE_PROTOCOL_COUNT; i++) {
        auto & p = this->data[i];
        p.enabled = false;
    }
}